

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O0

boolean l2_absorb_expr_atom(void)

{
  boolean bVar1;
  l2_token *plVar2;
  l2_token *__token_current_p_1;
  l2_token *__token_current_p;
  boolean inner_res;
  
  bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_LP);
  if (bVar1 == '\0') {
    bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_IDENTIFIER);
    if (bVar1 == '\0') {
      bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_INTEGER_LITERAL);
      if (bVar1 == '\0') {
        bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_REAL_LITERAL);
        if (bVar1 == '\0') {
          bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_STRING_LITERAL);
          if (bVar1 == '\0') {
            bVar1 = l2_parse_probe_next_token_by_type_and_str
                              (L2_TOKEN_KEYWORD,g_l2_token_keywords[0]);
            if (bVar1 == '\0') {
              bVar1 = l2_parse_probe_next_token_by_type_and_str
                                (L2_TOKEN_KEYWORD,g_l2_token_keywords[1]);
              if (bVar1 == '\0') {
                return '\0';
              }
              l2_parse_token_forward();
            }
            else {
              l2_parse_token_forward();
            }
          }
          else {
            l2_parse_token_forward();
          }
        }
        else {
          l2_parse_token_forward();
        }
      }
      else {
        l2_parse_token_forward();
      }
    }
    else {
      l2_parse_token_forward();
      bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_LP);
      if (bVar1 != '\0') {
        l2_parse_token_forward();
        l2_absorb_real_param_list();
        bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_RP);
        if (bVar1 == '\0') {
          l2_parse_token_forward();
          plVar2 = l2_parse_token_current();
          l2_parsing_error(L2_PARSING_ERROR_MISSING_RP,plVar2->current_line,plVar2->current_col);
        }
        l2_parse_token_forward();
      }
    }
    __token_current_p._7_1_ = '\x01';
  }
  else {
    l2_parse_token_forward();
    __token_current_p._7_1_ = l2_absorb_expr();
    bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_RP);
    if (bVar1 == '\0') {
      l2_parse_token_forward();
      plVar2 = l2_parse_token_current();
      l2_parsing_error(L2_PARSING_ERROR_MISSING_RP,plVar2->current_line,plVar2->current_col);
    }
    l2_parse_token_forward();
  }
  return __token_current_p._7_1_;
}

Assistant:

_if_type (L2_TOKEN_LP)
    {
        boolean inner_res = l2_absorb_expr();
        _if_type (L2_TOKEN_RP)
        { }
        _throw_missing_rp

        return inner_res;
    }